

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O1

void bcm2835_spi_transfernb(char *tbuf,char *rbuf,uint32_t len)

{
  uint32_t *paddr;
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  uint8_t uVar4;
  ulong uVar5;
  
  paddr = bcm2835_spi0;
  bcm2835_peri_set_bits(bcm2835_spi0,0x30,0x30);
  bcm2835_peri_set_bits(paddr,0x80,0x80);
  if (len != 0) {
    uVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 & 0xffffffff;
      while( true ) {
        if (debug == '\0') {
          bVar3 = (byte)(*paddr >> 0x12) & 1;
        }
        else {
          bVar3 = 0;
          printf("bcm2835_peri_read  paddr %p\n");
        }
        if ((bVar3 == 0) || (len <= uVar2)) break;
        bVar3 = tbuf[uVar2];
        if (bcm2835_spi_bit_order == '\0') {
          bVar3 = ""[bVar3];
        }
        if (debug == '\0') {
          paddr[1] = (uint)bVar3;
        }
        else {
          printf("bcm2835_peri_write_nb paddr %p, value %08X\n");
        }
        uVar2 = uVar2 + 1;
      }
      uVar1 = uVar1 & 0xffffffff;
      while( true ) {
        if (debug == '\0') {
          bVar3 = (byte)(*paddr >> 0x11) & 1;
        }
        else {
          bVar3 = 0;
          printf("bcm2835_peri_read  paddr %p\n");
        }
        if ((bVar3 == 0) || (len <= uVar1)) break;
        if (debug == '\0') {
          uVar5 = (ulong)paddr[1];
        }
        else {
          uVar5 = 0;
          printf("bcm2835_peri_read_nb  paddr %p\n");
        }
        uVar4 = (uint8_t)uVar5;
        if (bcm2835_spi_bit_order == '\0') {
          uVar4 = ""[uVar5 & 0xff];
        }
        rbuf[uVar1] = uVar4;
        uVar1 = uVar1 + 1;
      }
    } while ((uint)uVar1 < len || (uint)uVar2 < len);
  }
  do {
    while (debug != '\0') {
      printf("bcm2835_peri_read_nb  paddr %p\n");
    }
  } while ((*paddr >> 0x10 & 1) == 0);
  bcm2835_peri_set_bits(paddr,0,0x80);
  return;
}

Assistant:

void bcm2835_spi_transfernb(char* tbuf, char* rbuf, uint32_t len)
{
    volatile uint32_t* paddr = bcm2835_spi0 + BCM2835_SPI0_CS/4;
    volatile uint32_t* fifo = bcm2835_spi0 + BCM2835_SPI0_FIFO/4;
    uint32_t TXCnt=0;
    uint32_t RXCnt=0;

    /* This is Polled transfer as per section 10.6.1
    // BUG ALERT: what happens if we get interupted in this section, and someone else
    // accesses a different peripheral? 
    */

    /* Clear TX and RX fifos */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_CLEAR, BCM2835_SPI0_CS_CLEAR);

    /* Set TA = 1 */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_TA, BCM2835_SPI0_CS_TA);

    /* Use the FIFO's to reduce the interbyte times */
    while((TXCnt < len)||(RXCnt < len))
    {
        /* TX fifo not full, so add some more bytes */
        while(((bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_TXD))&&(TXCnt < len ))
        {
	    bcm2835_peri_write_nb(fifo, bcm2835_correct_order(tbuf[TXCnt]));
	    TXCnt++;
        }
        /* Rx fifo not empty, so get the next received bytes */
        while(((bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_RXD))&&( RXCnt < len ))
        {
	    rbuf[RXCnt] = bcm2835_correct_order(bcm2835_peri_read_nb(fifo));
	    RXCnt++;
        }
    }
    /* Wait for DONE to be set */
    while (!(bcm2835_peri_read_nb(paddr) & BCM2835_SPI0_CS_DONE))
	;

    /* Set TA = 0, and also set the barrier */
    bcm2835_peri_set_bits(paddr, 0, BCM2835_SPI0_CS_TA);
}